

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.cpp
# Opt level: O2

bool CorUnix::MTX_InternalTryEnterCriticalSection
               (CPalThread *pThread,PCRITICAL_SECTION pCriticalSection)

{
  int iVar1;
  HANDLE pVVar2;
  char *callingFuncName;
  
  callingFuncName = (char *)pCriticalSection;
  if (pCriticalSection->dwInitState == 0) {
    fprintf(_stderr,"] %s %s:%d","MTX_InternalTryEnterCriticalSection",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
            ,0x62b);
    callingFuncName = "Expression: PalCsNotInitialized != pPalCriticalSection->cisInitState\n";
    fprintf(_stderr,"Expression: PalCsNotInitialized != pPalCriticalSection->cisInitState\n");
  }
  pVVar2 = (HANDLE)ObtainCurrentThreadIdImpl(pThread,callingFuncName);
  if (pCriticalSection->OwningThread == pVVar2) {
    pCriticalSection->RecursionCount = pCriticalSection->RecursionCount + 1;
  }
  else {
    iVar1 = pthread_mutex_trylock((pthread_mutex_t *)&pCriticalSection->csnds);
    if (iVar1 != 0) {
      return false;
    }
    pCriticalSection->OwningThread = pVVar2;
    pCriticalSection->RecursionCount = 1;
  }
  return true;
}

Assistant:

bool MTX_InternalTryEnterCriticalSection(
        CPalThread * pThread,
        PCRITICAL_SECTION pCriticalSection)
#endif // MUTEX_BASED_CSS
    {
        PAL_CRITICAL_SECTION * pPalCriticalSection =
            reinterpret_cast<PAL_CRITICAL_SECTION*>(pCriticalSection);
        bool fRet;
        SIZE_T threadId;

        _ASSERTE(PalCsNotInitialized != pPalCriticalSection->cisInitState);

        threadId = ObtainCurrentThreadId(pThread);

        /* check if the current thread already owns the criticalSection */
        if (pPalCriticalSection->OwningThread == threadId)
        {
            pPalCriticalSection->RecursionCount += 1;
            fRet = true;
            goto ITECS_exit;
        }

        fRet = (0 == pthread_mutex_trylock(&pPalCriticalSection->csndNativeData.mutex));

        if (fRet)
        {
            pPalCriticalSection->OwningThread = threadId;
            pPalCriticalSection->RecursionCount = 1;
        }

    ITECS_exit:
        return fRet;
    }